

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkMiterQuantifyPis(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  Abc_Ntk_t *pAVar2;
  int local_24;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkTemp;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkHasOnlyLatchBoxes(pNtk);
  if (iVar1 != 0) {
    pNtkTemp = pNtk;
    for (local_24 = 0; iVar1 = Abc_NtkPiNum(pNtkTemp), local_24 < iVar1; local_24 = local_24 + 1) {
      pObj_00 = Abc_NtkPi(pNtkTemp,local_24);
      iVar1 = Abc_ObjFanoutNum(pObj_00);
      if (iVar1 != 0) {
        pAVar2 = Abc_NtkMiterQuantify(pNtkTemp,local_24,1);
        Abc_NtkDelete(pNtkTemp);
        pNtkTemp = pAVar2;
      }
    }
    return pNtkTemp;
  }
  __assert_fail("Abc_NtkHasOnlyLatchBoxes(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMiter.c"
                ,0x28d,"Abc_Ntk_t *Abc_NtkMiterQuantifyPis(Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkMiterQuantifyPis( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkTemp;
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkHasOnlyLatchBoxes(pNtk) );

    Abc_NtkForEachPi( pNtk, pObj, i )
    {
        if ( Abc_ObjFanoutNum(pObj) == 0 )
            continue;
        pNtk = Abc_NtkMiterQuantify( pNtkTemp = pNtk, i, 1 );
        Abc_NtkDelete( pNtkTemp );
    }

    return pNtk;
}